

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2test.c
# Opt level: O1

int callout_function(pcre2_callout_block_8 *cb,void *callout_data_ptr)

{
  byte bVar1;
  size_t sVar2;
  int iVar3;
  uint32_t uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  size_t __size;
  char *__ptr;
  FILE *__s;
  uint uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  
  uVar4 = dat_datctl.control;
  __s = (FILE *)outfile;
  if (((((byte)dat_datctl.control >> 6 | first_callout) & 1) == 0) &&
     (cb->callout_string == (PCRE2_SPTR8)0x0)) {
    __s = (FILE *)0x0;
  }
  uVar9 = compiled_code8->overall_options >> 0x13 & 1;
  if (cb->callout_string == (PCRE2_SPTR8)0x0) {
LAB_0010b44c:
    if ((uVar4 & 0x40) != 0) goto LAB_0010b456;
  }
  else {
    bVar1 = cb->callout_string[-1];
    uVar8 = (uint)bVar1;
    lVar10 = 0;
    fprintf((FILE *)outfile,"Callout (%lu): %c",cb->callout_string_offset,(ulong)bVar1);
    pchars8(cb->callout_string,(int)cb->callout_string_length,uVar9,outfile);
    do {
      if (*(uint *)((long)callout_start_delims + lVar10) == (uint)bVar1) {
        uVar8 = *(uint *)((long)callout_end_delims + lVar10);
        break;
      }
      lVar10 = lVar10 + 4;
    } while ((int)lVar10 != 0x20);
    fputc(uVar8,(FILE *)outfile);
    if ((uVar4 & 0x40) == 0) {
      fputc(10,(FILE *)outfile);
      goto LAB_0010b44c;
    }
LAB_0010b456:
    if (cb->callout_string == (PCRE2_SPTR8)0x0) {
      fprintf((FILE *)outfile,"Callout %d:",(ulong)cb->callout_number);
    }
    fprintf((FILE *)outfile," last capture = %d\n",(ulong)cb->capture_last);
    if ((cb->capture_top & 0x7fffffff) != 0) {
      uVar8 = 0;
      uVar11 = 0;
      do {
        fprintf((FILE *)outfile,"%2d: ",(ulong)uVar8);
        sVar2 = cb->offset_vector[uVar11];
        if (sVar2 == 0xffffffffffffffff) {
          fwrite("<unset>",7,1,(FILE *)outfile);
        }
        else {
          pchars8(cb->subject + sVar2,(int)cb->offset_vector[uVar11 + 1] - (int)sVar2,uVar9,
                  (FILE *)__s);
        }
        fputc(10,(FILE *)outfile);
        uVar11 = uVar11 + 2;
        uVar8 = uVar8 + 1;
      } while (uVar11 < cb->capture_top * 2);
    }
  }
  if (__s != (FILE *)0x0) {
    fwrite("--->",4,1,__s);
  }
  iVar5 = pchars8(cb->subject,(int)cb->start_match,uVar9,(FILE *)__s);
  iVar6 = pchars8(cb->subject + cb->start_match,(int)cb->current_position - (int)cb->start_match,
                  uVar9,(FILE *)__s);
  iVar7 = pchars8(cb->subject,(int)cb->subject_length,uVar9,(FILE *)0x0);
  pchars8(cb->subject + cb->current_position,(int)cb->subject_length - (int)cb->current_position,
          uVar9,(FILE *)__s);
  if (__s != (FILE *)0x0) {
    fputc(10,__s);
  }
  iVar3 = iVar5;
  if (cb->callout_number == 0xff) {
    fprintf((FILE *)outfile,"%+3d ",(ulong)(uint)cb->pattern_position);
    if (cb->pattern_position < 100) goto joined_r0x0010b631;
    __ptr = "\n    ";
    __size = 5;
  }
  else {
    if (((uVar4 & 0x40) == 0) && (cb->callout_string == (PCRE2_SPTR8)0x0)) {
      fprintf((FILE *)outfile,"%3d ");
      goto joined_r0x0010b631;
    }
    __ptr = "    ";
    __size = 4;
  }
  fwrite(__ptr,__size,1,(FILE *)outfile);
joined_r0x0010b631:
  for (; iVar3 != 0; iVar3 = iVar3 + -1) {
    fputc(0x20,(FILE *)outfile);
  }
  fputc(0x5e,(FILE *)outfile);
  iVar3 = iVar6;
  if (iVar6 != 0) {
    while (iVar3 + -1 != 0) {
      fputc(0x20,(FILE *)outfile);
      iVar3 = iVar3 + -1;
    }
    fputc(0x5e,(FILE *)outfile);
  }
  for (iVar5 = (iVar7 - (iVar5 + iVar6)) + 4; iVar5 != 0; iVar5 = iVar5 + -1) {
    fputc(0x20,(FILE *)outfile);
  }
  uVar11 = 1;
  if (cb->next_item_length != 0) {
    uVar11 = cb->next_item_length & 0xffffffff;
  }
  fprintf((FILE *)outfile,"%.*s",uVar11,pbuffer8 + cb->pattern_position);
  fputc(10,(FILE *)outfile);
  first_callout = 0;
  if (cb->mark != (PCRE2_SPTR8)last_callout_mark) {
    if (cb->mark == (PCRE2_SPTR8)0x0) {
      fwrite("Latest Mark: <unset>\n",0x15,1,(FILE *)outfile);
    }
    else {
      fwrite("Latest Mark: ",0xd,1,(FILE *)outfile);
      pchars8(cb->mark,-1,uVar9,outfile);
      putc(10,(FILE *)outfile);
    }
    last_callout_mark = cb->mark;
  }
  if (callout_data_ptr != (void *)0x0) {
    uVar9 = *callout_data_ptr;
    if (uVar9 != 0) {
      fprintf((FILE *)outfile,"Callout data = %d\n",(ulong)uVar9);
      return uVar9;
    }
  }
  uVar9 = 0;
  if (cb->callout_number == dat_datctl.cfail[0]) {
    callout_count = callout_count + 1;
    uVar9 = (uint)(dat_datctl.cfail[1] <= callout_count);
  }
  return uVar9;
}

Assistant:

static int
callout_function(pcre2_callout_block_8 *cb, void *callout_data_ptr)
{
uint32_t i, pre_start, post_start, subject_length;
BOOL utf = (FLD(compiled_code, overall_options) & PCRE2_UTF) != 0;
BOOL callout_capture = (dat_datctl.control & CTL_CALLOUT_CAPTURE) != 0;

/* This FILE is used for echoing the subject. This is done only once in simple
cases. */

FILE *f = (first_callout || callout_capture || cb->callout_string != NULL)?
  outfile : NULL;

/* For a callout with a string argument, show the string first because there
isn't a tidy way to fit it in the rest of the data. */

if (cb->callout_string != NULL)
  {
  uint32_t delimiter = CODE_UNIT(cb->callout_string, -1);
  fprintf(outfile, "Callout (%lu): %c",
    (unsigned long int)cb->callout_string_offset, delimiter);
  PCHARSV(cb->callout_string, 0,
    cb->callout_string_length, utf, outfile);
  for (i = 0; callout_start_delims[i] != 0; i++)
    if (delimiter == callout_start_delims[i])
      {
      delimiter = callout_end_delims[i];
      break;
      }
  fprintf(outfile, "%c", delimiter);
  if (!callout_capture) fprintf(outfile, "\n");
  }

/* Show captured strings if required */

if (callout_capture)
  {
  if (cb->callout_string == NULL)
    fprintf(outfile, "Callout %d:", cb->callout_number);
  fprintf(outfile, " last capture = %d\n", cb->capture_last);
  for (i = 0; i < cb->capture_top * 2; i += 2)
    {
    fprintf(outfile, "%2d: ", i/2);
    if (cb->offset_vector[i] == PCRE2_UNSET)
      fprintf(outfile, "<unset>");
    else
      {
      PCHARSV(cb->subject, cb->offset_vector[i],
        cb->offset_vector[i+1] - cb->offset_vector[i], utf, f);
      }
    fprintf(outfile, "\n");
    }
  }

/* Re-print the subject in canonical form, the first time or if giving full
datails. On subsequent calls in the same match, we use pchars just to find the
printed lengths of the substrings. */

if (f != NULL) fprintf(f, "--->");

PCHARS(pre_start, cb->subject, 0, cb->start_match, utf, f);

PCHARS(post_start, cb->subject, cb->start_match,
  cb->current_position - cb->start_match, utf, f);

PCHARS(subject_length, cb->subject, 0, cb->subject_length, utf, NULL);

PCHARSV(cb->subject, cb->current_position,
  cb->subject_length - cb->current_position, utf, f);

if (f != NULL) fprintf(f, "\n");

/* For automatic callouts, show the pattern offset. Otherwise, for a numerical
callout whose number has not already been shown with captured strings, show the
number here. A callout with a string argument has been displayed above. */

if (cb->callout_number == 255)
  {
  fprintf(outfile, "%+3d ", (int)cb->pattern_position);
  if (cb->pattern_position > 99) fprintf(outfile, "\n    ");
  }
else
  {
  if (callout_capture || cb->callout_string != NULL) fprintf(outfile, "    ");
    else fprintf(outfile, "%3d ", cb->callout_number);
  }

/* Now show position indicators */

for (i = 0; i < pre_start; i++) fprintf(outfile, " ");
fprintf(outfile, "^");

if (post_start > 0)
  {
  for (i = 0; i < post_start - 1; i++) fprintf(outfile, " ");
  fprintf(outfile, "^");
  }

for (i = 0; i < subject_length - pre_start - post_start + 4; i++)
  fprintf(outfile, " ");

fprintf(outfile, "%.*s",
  (int)((cb->next_item_length == 0)? 1 : cb->next_item_length),
  pbuffer8 + cb->pattern_position);

fprintf(outfile, "\n");
first_callout = FALSE;

if (cb->mark != last_callout_mark)
  {
  if (cb->mark == NULL)
    fprintf(outfile, "Latest Mark: <unset>\n");
  else
    {
    fprintf(outfile, "Latest Mark: ");
    PCHARSV(cb->mark, 0, -1, utf, outfile);
    putc('\n', outfile);
    }
  last_callout_mark = cb->mark;
  }

if (callout_data_ptr != NULL)
  {
  int callout_data = *((int32_t *)callout_data_ptr);
  if (callout_data != 0)
    {
    fprintf(outfile, "Callout data = %d\n", callout_data);
    return callout_data;
    }
  }

return (cb->callout_number != dat_datctl.cfail[0])? 0 :
       (++callout_count >= dat_datctl.cfail[1])? 1 : 0;
}